

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

Vec3 OpenSteer::directionFromCameraToScreenPosition(int x,int y,int h)

{
  return (Vec3)ZEXT412(0x3f800000);
}

Assistant:

OpenSteer::Vec3 
OpenSteer::directionFromCameraToScreenPosition (int x, int y, int h)
{
    return Vec3(1, 0, 0);

/// @TODO, switch OpenSteer to use a newer linear algebra library such as linalg
#if 0
    // Get window height, viewport, modelview and projection matrices
    GLint vp[4];
    GLdouble mMat[16], pMat[16];
    glGetIntegerv (GL_VIEWPORT, vp);
    glGetDoublev (GL_MODELVIEW_MATRIX, mMat);
    glGetDoublev (GL_PROJECTION_MATRIX, pMat);
    GLdouble un0x, un0y, un0z, un1x, un1y, un1z;

    // Unproject mouse position at near and far clipping planes
    gluUnProject (x, h-y, 0, mMat, pMat, vp, &un0x, &un0y, &un0z);
    gluUnProject (x, h-y, 1, mMat, pMat, vp, &un1x, &un1y, &un1z);

    // "direction" is the normalized difference between these far and near
    // unprojected points.  Its parallel to the "eye-mouse" selection line.
    const Vec3 diffNearFar (static_cast<float>(un1x-un0x), static_cast<float>(un1y-un0y), static_cast<float>(un1z-un0z));
    const Vec3 direction = diffNearFar.normalize ();
    return direction;
#endif
}